

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_storage_batch.c
# Opt level: O2

log_policy_interface log_policy_storage_batch_interface(void)

{
  return &log_policy_storage_batch_interface::policy_interface_storage;
}

Assistant:

log_policy_interface log_policy_storage_batch_interface(void)
{
	static struct log_policy_storage_impl_type log_policy_storage_batch_impl_obj = {
		&log_policy_storage_batch_append,
		&log_policy_storage_batch_flush
	};

	static struct log_policy_interface_type policy_interface_storage = {
		&log_policy_storage_batch_create,
		&log_policy_storage_batch_impl_obj,
		&log_policy_storage_batch_destroy
	};

	return &policy_interface_storage;
}